

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Client * __thiscall
capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Pipeline::getCap
          (Client *__return_storage_ptr__,Pipeline *this)

{
  Pipeline local_50;
  Own<capnp::ClientHook,_std::nullptr_t> local_28;
  PipelineOp *local_18;
  Pipeline *this_local;
  
  local_18 = (PipelineOp *)this;
  this_local = (Pipeline *)__return_storage_ptr__;
  ::capnp::AnyPointer::Pipeline::getPointerField(&local_50,&this->_typeless,0);
  ::capnp::AnyPointer::Pipeline::asCap((Pipeline *)&local_28);
  TestInterface::Client::Client(__return_storage_ptr__,&local_28);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_28);
  ::capnp::AnyPointer::Pipeline::~Pipeline(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestInterface::Client TestMoreStuff::GetHeldResults::Pipeline::getCap() {
  return  ::capnproto_test::capnp::test::TestInterface::Client(_typeless.getPointerField(0).asCap());
}